

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

void stbi__grow_buffer_unsafe(stbi__jpeg *j)

{
  stbi_uc sVar1;
  int iVar2;
  byte *pbVar3;
  stbi_uc *psVar4;
  uint uVar5;
  stbi__context *psVar6;
  stbi_uc **ppsVar7;
  
  do {
    uVar5 = 0;
    if (j->nomore == 0) {
      psVar6 = j->s;
      pbVar3 = psVar6->img_buffer;
      if (psVar6->img_buffer_end <= pbVar3) {
        if (psVar6->read_from_callbacks == 0) goto LAB_0013327f;
        psVar4 = psVar6->buffer_start;
        iVar2 = (*(psVar6->io).read)(psVar6->io_user_data,(char *)psVar4,psVar6->buflen);
        if (iVar2 == 0) {
          psVar6->read_from_callbacks = 0;
          psVar6->img_buffer = psVar4;
          psVar6->img_buffer_end = psVar6->buffer_start + 1;
          psVar6->buffer_start[0] = '\0';
        }
        else {
          psVar6->img_buffer = psVar4;
          psVar6->img_buffer_end = psVar4 + iVar2;
        }
        pbVar3 = psVar6->img_buffer;
      }
      psVar6->img_buffer = pbVar3 + 1;
      uVar5 = (uint)*pbVar3;
    }
LAB_0013327f:
    if (uVar5 == 0xff) {
      psVar6 = j->s;
      ppsVar7 = &psVar6->img_buffer;
      psVar4 = psVar6->img_buffer;
      if (psVar4 < psVar6->img_buffer_end) goto LAB_001332b4;
      if (psVar6->read_from_callbacks != 0) goto LAB_001332ec;
      sVar1 = '\0';
LAB_001332bd:
      if (sVar1 == 0xff) {
        psVar6 = j->s;
        psVar4 = psVar6->img_buffer;
        if (psVar6->img_buffer_end <= psVar4) break;
        ppsVar7 = &psVar6->img_buffer;
        goto LAB_001332b4;
      }
      if (sVar1 != '\0') {
        j->marker = sVar1;
        j->nomore = 1;
        return;
      }
    }
    iVar2 = j->code_bits;
    j->code_buffer = j->code_buffer | uVar5 << (0x18U - (char)iVar2 & 0x1f);
    j->code_bits = iVar2 + 8;
    if (0x10 < iVar2) {
      return;
    }
  } while( true );
  sVar1 = '\0';
  if (psVar6->read_from_callbacks != 0) {
    ppsVar7 = &psVar6->img_buffer;
LAB_001332ec:
    psVar4 = psVar6->buffer_start;
    iVar2 = (*(psVar6->io).read)(psVar6->io_user_data,(char *)psVar4,psVar6->buflen);
    if (iVar2 == 0) {
      psVar6->read_from_callbacks = 0;
      psVar6->img_buffer = psVar4;
      psVar6->img_buffer_end = psVar6->buffer_start + 1;
      psVar6->buffer_start[0] = '\0';
    }
    else {
      psVar6->img_buffer = psVar4;
      psVar6->img_buffer_end = psVar4 + iVar2;
    }
    psVar4 = *ppsVar7;
LAB_001332b4:
    *ppsVar7 = psVar4 + 1;
    sVar1 = *psVar4;
  }
  goto LAB_001332bd;
}

Assistant:

static void stbi__grow_buffer_unsafe(stbi__jpeg *j)
{
   do {
      int b = j->nomore ? 0 : stbi__get8(j->s);
      if (b == 0xff) {
         int c = stbi__get8(j->s);
         while (c == 0xff) c = stbi__get8(j->s); // consume fill bytes
         if (c != 0) {
            j->marker = (unsigned char) c;
            j->nomore = 1;
            return;
         }
      }
      j->code_buffer |= b << (24 - j->code_bits);
      j->code_bits += 8;
   } while (j->code_bits <= 24);
}